

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

void __thiscall V2Voice::noteOn(V2Voice *this,int note,int vel)

{
  V2Instance *pVVar1;
  V2Flt *pVVar2;
  V2Osc *this_00;
  int i;
  long lVar3;
  
  this->note = note;
  updateNote(this);
  this->velo = (float)vel;
  this->gate = true;
  this->env[0].state = ATTACK;
  this->env[1].state = ATTACK;
  if (this->keysync != 1) {
    if (this->keysync != 2) goto LAB_0010c6a2;
    this->env[0].val = 0.0;
    this->env[1].val = 0.0;
    this->curvol = 0.0;
    this_00 = this->osc;
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      V2Osc::init(this_00,(EVP_PKEY_CTX *)this->inst);
      this_00 = this_00 + 1;
    }
    pVVar1 = this->inst;
    this->vcf[0].lrc.l = 0.0;
    this->vcf[0].lrc.b = 0.0;
    this->vcf[0].moog.b[0] = 0.0;
    this->vcf[0].moog.b[1] = 0.0;
    this->vcf[0].moog.b[1] = 0.0;
    this->vcf[0].moog.b[2] = 0.0;
    this->vcf[0].moog.b[3] = 0.0;
    this->vcf[0].moog.b[4] = 0.0;
    this->vcf[0].inst = pVVar1;
    this->vcf[1].lrc.l = 0.0;
    this->vcf[1].lrc.b = 0.0;
    this->vcf[1].moog.b[0] = 0.0;
    this->vcf[1].moog.b[1] = 0.0;
    this->vcf[1].moog.b[1] = 0.0;
    this->vcf[1].moog.b[2] = 0.0;
    this->vcf[1].moog.b[3] = 0.0;
    this->vcf[1].moog.b[4] = 0.0;
    this->vcf[1].inst = pVVar1;
    (this->dist).dcount = 0;
    (this->dist).dvall = 0.0;
    (this->dist).dvalr = 0.0;
    (this->dist).fltl.lrc.l = 0.0;
    (this->dist).fltl.lrc.b = 0.0;
    (this->dist).fltl.moog.b[0] = 0.0;
    (this->dist).fltl.moog.b[1] = 0.0;
    pVVar2 = &(this->dist).fltl;
    (pVVar2->moog).b[1] = 0.0;
    (pVVar2->moog).b[2] = 0.0;
    pVVar2 = &(this->dist).fltl;
    (pVVar2->moog).b[3] = 0.0;
    (pVVar2->moog).b[4] = 0.0;
    (this->dist).fltl.inst = pVVar1;
    (this->dist).fltr.lrc.l = 0.0;
    (this->dist).fltr.lrc.b = 0.0;
    (this->dist).fltr.moog.b[0] = 0.0;
    (this->dist).fltr.moog.b[1] = 0.0;
    pVVar2 = &(this->dist).fltr;
    (pVVar2->moog).b[1] = 0.0;
    (pVVar2->moog).b[2] = 0.0;
    pVVar2 = &(this->dist).fltr;
    (pVVar2->moog).b[3] = 0.0;
    (pVVar2->moog).b[4] = 0.0;
    (this->dist).fltr.inst = pVVar1;
  }
  for (lVar3 = 0x38; lVar3 != 0xf8; lVar3 = lVar3 + 0x40) {
    *(undefined4 *)((long)this->osc + lVar3 + -0x30) = 0;
  }
LAB_0010c6a2:
  for (lVar3 = 0x30; lVar3 != 0xf0; lVar3 = lVar3 + 0x40) {
    V2Osc::chgPitch((V2Osc *)((long)this->osc + lVar3 + -0x30));
  }
  for (lVar3 = 0; lVar3 != 0x50; lVar3 = lVar3 + 0x28) {
    if ((&this->lfo[0].sync)[lVar3] == true) {
      *(undefined4 *)((long)&this->lfo[0].cntr + lVar3) =
           *(undefined4 *)((long)&this->lfo[0].cphase + lVar3);
      *(undefined4 *)((long)&this->lfo[0].last + lVar3) = 0xffffffff;
    }
  }
  (this->dcf).inst = this->inst;
  (this->dcf).fl.xm1 = 0.0;
  (this->dcf).fl.ym1 = 0.0;
  (this->dcf).fr.xm1 = 0.0;
  (this->dcf).fr.ym1 = 0.0;
  return;
}

Assistant:

void noteOn(int note, int vel)
    {
        this->note = note;
        updateNote();

        velo = (float)vel;
        gate = true;

        // reset EGs
        for (int i=0; i < syVV2::NENV; i++)
            env[i].state = V2Env::ATTACK;

        // process sync
        switch (keysync)
        {
        case SYNC_FULL:
            COVER("VOICE noteOn sync full");
            for (int i=0; i < syVV2::NENV; i++)
                env[i].val = 0.0f;
            curvol = 0.0f;

            for (int i=0; i < syVV2::NOSC; i++)
                osc[i].init(inst, i);

            for (int i=0; i < syVV2::NFLT; i++)
                vcf[i].init(inst);

            dist.init(inst);
            // fall-through

        case SYNC_OSC:
            COVER("VOICE noteOn sync osc");
            for (int i=0; i < syVV2::NOSC; i++)
                osc[i].cnt = 0;
            // fall-through

        case SYNC_NONE:
        default:
            break;
        }

        for (int i=0; i < syVV2::NOSC; i++)
            osc[i].chgPitch();

        for (int i=0; i < syVV2::NLFO; i++)
            lfo[i].keyOn();

        dcf.init(inst);
    }